

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

value_type __thiscall djb::abc::ndf(abc *this,vec3 *wh)

{
  double dVar1;
  long lVar2;
  long in_RDX;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar3;
  long lVar4;
  double dVar5;
  value_type vVar6;
  
  (**(code **)(*(long *)wh + 0x10))();
  pfVar3 = extraout_RDX;
  if (0 < *(int *)&(this->super_brdf_rgb).super_brdf._vptr_brdf) {
    lVar4 = 0;
    do {
      lVar2 = *(long *)&wh[1].y;
      dVar1 = *(double *)(lVar2 + 0x20 + lVar4 * 8);
      dVar5 = pow((1.0 - (double)*(float *)(in_RDX + 8)) * *(double *)(lVar2 + 0x38) + 1.0,
                  *(double *)(lVar2 + 0x40));
      *(float *)((long)&((this->m_fresnel).m_f)->_vptr_impl + lVar4 * 4) = (float)(dVar1 / dVar5);
      lVar4 = lVar4 + 1;
      pfVar3 = extraout_RDX_00;
    } while (lVar4 < *(int *)&(this->super_brdf_rgb).super_brdf._vptr_brdf);
  }
  vVar6._M_data = pfVar3;
  vVar6._M_size = (size_t)this;
  return vVar6;
}

Assistant:

brdf::value_type abc::ndf(const vec3 &wh) const
{
	brdf::value_type ndf = zero_value();

	for (int i = 0; i < (int)ndf.size(); ++i)
		ndf[i] = (float_t)abc__ndf((double)wh.z,
								   m_data->A[i],
								   m_data->B,
								   m_data->C);

	return ndf;
}